

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O2

APInt * __thiscall llvm::APInt::operator|=(APInt *this,APInt *RHS)

{
  if (this->BitWidth == RHS->BitWidth) {
    if (this->BitWidth < 0x41) {
      (this->U).VAL = (this->U).VAL | (RHS->U).VAL;
    }
    else {
      OrAssignSlowCase(this,RHS);
    }
    return this;
  }
  __assert_fail("BitWidth == RHS.BitWidth && \"Bit widths must be the same\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APInt.h"
                ,0x336,"APInt &llvm::APInt::operator|=(const APInt &)");
}

Assistant:

APInt &operator|=(const APInt &RHS) {
    assert(BitWidth == RHS.BitWidth && "Bit widths must be the same");
    if (isSingleWord())
      U.VAL |= RHS.U.VAL;
    else
      OrAssignSlowCase(RHS);
    return *this;
  }